

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_add_between_face_interior
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_DBL node1_weight,REF_INT new_node)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_DBL *pRVar1;
  uint uVar2;
  uint uVar3;
  REF_STATUS RVar4;
  uint uVar5;
  int iVar6;
  double dVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  REF_INT ncell;
  REF_INT sense;
  REF_INT id;
  REF_INT cells [2];
  REF_DBL r0;
  REF_DBL r1;
  REF_DBL uv [2];
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  REF_INT nodes2 [27];
  REF_INT nodes3 [27];
  double local_1d0;
  int local_1c4;
  REF_INT local_1c0;
  REF_INT local_1bc;
  double local_1b8;
  undefined8 uStack_1b0;
  REF_INT local_1a0;
  REF_INT local_19c;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  REF_DBL local_158;
  REF_DBL local_150;
  REF_DBL local_148;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  REF_INT local_118 [28];
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  ref_geom = ref_grid->geom;
  uVar2 = ref_geom_unique_id(ref_geom,new_node,2,&local_1bc);
  if (uVar2 == 0) {
    uVar3 = ref_cell_list_with2(ref_cell,node0,node1,2,&local_1c4,&local_1a0);
    if (uVar3 == 0) {
      if ((long)local_1c4 != 2) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x464,"ref_geom_add_between_face_interior","expected two tri for box2 nodes",2,
               (long)local_1c4);
        uVar2 = 1;
      }
      uVar3 = uVar2;
      if (local_1c4 == 2) {
        uVar3 = ref_cell_nodes(ref_cell,local_1a0,local_118);
        if (uVar3 == 0) {
          uVar3 = ref_cell_nodes(ref_cell,local_19c,local_a8);
          if (uVar3 == 0) {
            uVar3 = ref_geom_cell_tuv(ref_geom,node0,local_118,2,&local_128,&local_1c0);
            if (uVar3 == 0) {
              uVar3 = ref_geom_cell_tuv(ref_geom,node1,local_118,2,&local_138,&local_1c0);
              if (uVar3 == 0) {
                local_180 = local_138;
                local_170 = local_128;
                local_198 = (1.0 - node1_weight) * local_128 + local_138 * node1_weight;
                local_188 = local_130;
                local_178 = local_120;
                local_190 = (1.0 - node1_weight) * local_120 + local_130 * node1_weight;
                pRVar1 = ref_node->real;
                local_1b8 = (double)(long)(new_node * 0xf);
                local_158 = pRVar1[(long)local_1b8];
                local_150 = pRVar1[(long)local_1b8 + 1];
                local_148 = pRVar1[(long)local_1b8 + 2];
                RVar4 = ref_egads_invert(ref_geom,2,local_1bc,&local_158,&local_198);
                bVar8 = true;
                dVar7 = local_1b8;
                uVar3 = uVar2;
                if (RVar4 == 0) {
                  uVar5 = ref_geom_add(ref_geom,new_node,2,local_1bc,&local_198);
                  bVar8 = uVar5 == 0;
                  dVar7 = local_1b8;
                  if (!bVar8) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0x476,"ref_geom_add_between_face_interior",(ulong)uVar5);
                    dVar7 = local_1b8;
                    uVar3 = uVar5;
                  }
                }
                if (bVar8) {
                  iVar6 = 10;
                  local_1b8 = 0.0;
                  local_1d0 = 1.0;
                  local_168 = node1_weight;
                  do {
                    uStack_1b0 = 0;
                    local_158 = (1.0 - local_168) * local_170 + local_180 * local_168;
                    local_150 = (1.0 - local_168) * local_178 + local_188 * local_168;
                    uVar2 = ref_geom_add(ref_geom,new_node,2,local_1bc,&local_158);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x480,"ref_geom_add_between_face_interior",(ulong)uVar2);
                      return uVar2;
                    }
                    uVar2 = ref_egads_eval_at(ref_geom,2,local_1bc,&local_158,
                                              ref_node->real + (long)dVar7,(REF_DBL *)0x0);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x483,"ref_geom_add_between_face_interior",(ulong)uVar2);
                      return uVar2;
                    }
                    uVar2 = ref_node_ratio(ref_node,node0,new_node,&local_198);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x484,"ref_geom_add_between_face_interior",(ulong)uVar2);
                      return uVar2;
                    }
                    uVar2 = ref_node_ratio(ref_node,node1,new_node,&local_160);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0x485,"ref_geom_add_between_face_interior",(ulong)uVar2);
                      return uVar2;
                    }
                    dVar10 = (local_160 + local_198) * 1e+20;
                    if (dVar10 <= -dVar10) {
                      dVar10 = -dVar10;
                    }
                    dVar9 = local_198;
                    if (local_198 <= -local_198) {
                      dVar9 = -local_198;
                    }
                    uVar3 = 0;
                    if (dVar10 <= dVar9) {
                      return 0;
                    }
                    dVar10 = local_198 / (local_160 + local_198) - node1_weight;
                    if ((iVar6 != 10) &&
                       (((0.0 < local_1b8 && (dVar10 < 0.0)) ||
                        ((local_1b8 < 0.0 && (0.0 < dVar10)))))) {
                      local_1d0 = local_1d0 * 0.5;
                    }
                    dVar9 = 0.05;
                    if (dVar10 <= 0.05) {
                      dVar9 = dVar10;
                    }
                    local_1b8 = -0.05;
                    if (-0.05 <= dVar9) {
                      local_1b8 = dVar9;
                    }
                    dVar10 = local_1b8;
                    if (local_1b8 <= -local_1b8) {
                      dVar10 = -local_1b8;
                    }
                    if (dVar10 < 0.005) {
                      return 0;
                    }
                    local_168 = local_168 - local_1d0 * local_1b8;
                    dVar10 = 0.99;
                    if (local_168 <= 0.99) {
                      dVar10 = local_168;
                    }
                    local_168 = 0.01;
                    if (0.01 <= dVar10) {
                      local_168 = dVar10;
                    }
                    iVar6 = iVar6 + -1;
                  } while (iVar6 != 0);
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x46b,"ref_geom_add_between_face_interior",(ulong)uVar3);
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x469,"ref_geom_add_between_face_interior",(ulong)uVar3,"cell uv0");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x466,"ref_geom_add_between_face_interior",(ulong)uVar3,"cell nodes");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x465,"ref_geom_add_between_face_interior",(ulong)uVar3,"cell nodes");
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x463,
             "ref_geom_add_between_face_interior",(ulong)uVar3,"list");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x461,
           "ref_geom_add_between_face_interior",(ulong)uVar2,"unique face id");
    uVar3 = uVar2;
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_geom_add_between_face_interior(
    REF_GRID ref_grid, REF_INT node0, REF_INT node1, REF_DBL node1_weight,
    REF_INT new_node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT type, id;
  REF_DBL uv[2], uv0[2], uv1[2];
  REF_INT sense, ncell, cells[2];
  REF_INT nodes2[REF_CELL_MAX_SIZE_PER];
  REF_INT nodes3[REF_CELL_MAX_SIZE_PER];
  REF_DBL r0, r1;
  REF_DBL weight, actual, error, relax, last_error;
  REF_BOOL verbose = REF_FALSE;
  REF_INT i;

  type = REF_GEOM_FACE;
  RSS(ref_geom_unique_id(ref_geom, new_node, type, &id), "unique face id");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  REIS(2, ncell, "expected two tri for box2 nodes");
  RSS(ref_cell_nodes(ref_cell, cells[0], nodes2), "cell nodes");
  RSS(ref_cell_nodes(ref_cell, cells[1], nodes3), "cell nodes");

  RSS(ref_geom_cell_tuv(ref_geom, node0, nodes2, type, uv0, &sense),
      "cell uv0");
  RSS(ref_geom_cell_tuv(ref_geom, node1, nodes2, type, uv1, &sense),
      "cell uv1");

  {
    REF_DBL temp_uv[2], temp_xyz[3];
    temp_uv[0] = (1.0 - node1_weight) * uv0[0] + node1_weight * uv1[0];
    temp_uv[1] = (1.0 - node1_weight) * uv0[1] + node1_weight * uv1[1];
    temp_xyz[0] = ref_node_xyz(ref_node, 0, new_node);
    temp_xyz[1] = ref_node_xyz(ref_node, 1, new_node);
    temp_xyz[2] = ref_node_xyz(ref_node, 2, new_node);
    if (REF_SUCCESS ==
        ref_egads_invert(ref_geom, type, id, temp_xyz, temp_uv)) {
      RSS(ref_geom_add(ref_geom, new_node, type, id, temp_uv), "new geom");
    };
  }

  weight = node1_weight;
  relax = 1.0;
  error = 0.0;
  for (i = 0; i < 10; i++) {
    uv[0] = (1.0 - weight) * uv0[0] + weight * uv1[0];
    uv[1] = (1.0 - weight) * uv0[1] + weight * uv1[1];
    RSS(ref_geom_add(ref_geom, new_node, type, id, uv), "new geom");
    RSS(ref_egads_eval_at(ref_geom, type, id, uv,
                          ref_node_xyz_ptr(ref_node, new_node), NULL),
        "eval");
    RSS(ref_node_ratio(ref_node, node0, new_node, &r0), "get r0");
    RSS(ref_node_ratio(ref_node, node1, new_node, &r1), "get r1");
    if (!ref_math_divisible(r0, (r0 + r1))) break;
    actual = r0 / (r0 + r1);
    last_error = error;
    error = actual - node1_weight;
    if (i > 0 &&
        ((error < 0 && last_error > 0) || (error > 0 && last_error < 0)))
      relax *= 0.5;
    if (verbose)
      printf("target %f actual %f adjust %f errro %f\n", node1_weight, actual,
             weight, error);
    error = MAX(-0.05, MIN(0.05, error));
    weight = weight - relax * error;
    weight = MAX(0.01, MIN(0.99, weight));
    if (ABS(error) < 0.005) break;
  }

  return REF_SUCCESS;
}